

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

void sb_return_reusable_blocks(fdb_kvs_handle *handle)

{
  superblock *psVar1;
  sb_rsv_bmp *__ptr;
  bool bVar2;
  filemgr *file;
  __pointer_type bmp;
  avl_node *paVar3;
  avl_node *paVar4;
  avl_node **ppaVar5;
  __int_type _Var6;
  fdb_kvs_handle *in_RDI;
  filemgr_header_revnum_t revnum;
  uint64_t sb_bmp_size;
  bmp_idx_node query;
  bmp_idx_node *item;
  avl_node *a;
  sb_rsv_bmp *rsv;
  superblock *sb;
  bid_t cur;
  uint64_t node_id;
  uint32_t in_stack_ffffffffffffff88;
  memory_order in_stack_ffffffffffffff8c;
  avl_tree *in_stack_ffffffffffffff90;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff98;
  avl_node *in_stack_ffffffffffffffb8;
  avl_tree *in_stack_ffffffffffffffc0;
  filemgr *local_18;
  
  psVar1 = in_RDI->file->sb;
  if (psVar1 != (superblock *)0x0) {
    file = (filemgr *)
           atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_ffffffffffffff90,
                               in_stack_ffffffffffffff8c);
    for (local_18 = (filemgr *)
                    atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_ffffffffffffff90,
                                        in_stack_ffffffffffffff8c); local_18 < file;
        local_18 = (filemgr *)((long)&local_18->filename + 1)) {
      bmp = std::atomic::operator_cast_to_unsigned_char_((atomic<unsigned_char_*> *)0x184d3c);
      bVar2 = _is_bmp_set(bmp,(bid_t)local_18);
      if (bVar2) {
        filemgr_add_stale_block
                  (file,(bid_t)in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
      }
      if ((((ulong)local_18 & 0xff) == 0) && (local_18 != (filemgr *)0x0)) {
        paVar3 = (avl_node *)((ulong)local_18 >> 8);
        paVar4 = avl_search((avl_tree *)((long)&paVar3[-1].right + 7),(avl_node *)file,
                            (avl_cmp_func *)in_stack_ffffffffffffff98);
        if (paVar4 != (avl_node *)0x0) {
          avl_remove(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          free(&paVar4[-1].right);
        }
        while (paVar4 = avl_first(&psVar1->bmp_idx), local_18 = file, paVar4 != (avl_node *)0x0) {
          ppaVar5 = &paVar4[-1].right;
          if (paVar3 < *ppaVar5) {
            local_18 = (filemgr *)((long)*ppaVar5 << 8);
            break;
          }
          avl_remove(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          free(ppaVar5);
        }
      }
    }
    psVar1->num_free_blocks = 0;
    atomic_store_uint64_t
              ((atomic<unsigned_long> *)in_stack_ffffffffffffff90,
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),memory_order_relaxed);
    __ptr = psVar1->rsv_bmp;
    if ((__ptr != (sb_rsv_bmp *)0x0) &&
       (bVar2 = atomic_cas_uint32_t((atomic<unsigned_int> *)in_stack_ffffffffffffff90,
                                    in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88), bVar2)) {
      for (local_18 = (filemgr *)__ptr->cur_alloc_bid; local_18 < __ptr->bmp_size;
          local_18 = (filemgr *)((long)local_18 + 1)) {
        bVar2 = _is_bmp_set(__ptr->bmp,(bid_t)local_18);
        if (bVar2) {
          filemgr_add_stale_block
                    (file,(bid_t)in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
        }
        if ((((ulong)local_18 & 0xff) == 0) && (local_18 != (filemgr *)0x0)) {
          paVar3 = avl_search((avl_tree *)
                              ((long)&((avl_node *)((ulong)local_18 >> 8))[-1].right + 7),
                              (avl_node *)file,(avl_cmp_func *)in_stack_ffffffffffffff98);
          if (paVar3 != (avl_node *)0x0) {
            avl_remove(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
            free(&paVar3[-1].right);
          }
          while (paVar3 = avl_first(&__ptr->bmp_idx), paVar3 != (avl_node *)0x0) {
            ppaVar5 = &paVar3[-1].right;
            if ((avl_node *)((ulong)local_18 >> 8) < *ppaVar5) {
              local_18 = (filemgr *)((long)*ppaVar5 << 8);
              goto LAB_00185065;
            }
            avl_remove(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
            free(ppaVar5);
          }
          local_18 = (filemgr *)__ptr->bmp_size;
        }
LAB_00185065:
      }
      __ptr->num_free_blocks = 0;
      __ptr->cur_alloc_bid = 0xffffffffffffffff;
      _free_bmp_idx(in_stack_ffffffffffffff90);
      _rsv_free((sb_rsv_bmp *)0x1850ac);
      free(__ptr);
      psVar1->rsv_bmp = (sb_rsv_bmp *)0x0;
    }
    _Var6 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff98);
    fdb_gather_stale_blocks
              (in_RDI,_Var6 + 1,0xffffffffffffffff,0xffffffffffffffff,0,(list_elem *)0x0,false);
  }
  return;
}

Assistant:

void sb_return_reusable_blocks(fdb_kvs_handle *handle)
{
    uint64_t node_id;
    bid_t cur;
    struct superblock *sb = handle->file->sb;
    struct sb_rsv_bmp *rsv;
    struct avl_node *a;
    struct bmp_idx_node *item, query;

    if (!sb) {
        // we don't need to do this.
        return;
    }

    // re-insert all remaining bitmap into stale list
    uint64_t sb_bmp_size = atomic_get_uint64_t(&sb->bmp_size);
    for (cur = atomic_get_uint64_t(&sb->cur_alloc_bid); cur < sb_bmp_size; ++cur) {
        if (_is_bmp_set(sb->bmp, cur)) {
            filemgr_add_stale_block(handle->file, cur, 1);
        }

        if ((cur % 256) == 0 && cur > 0) {
            // node ID changes
            // remove & free current bmp node
            node_id = cur / 256;
            query.id = node_id - 1;
            a = avl_search(&sb->bmp_idx, &query.avl, _bmp_idx_cmp);
            if (a) {
                item = _get_entry(a, struct bmp_idx_node, avl);
                avl_remove(&sb->bmp_idx, a);
                free(item);
            }

            // move to next bmp node
            do {
                a = avl_first(&sb->bmp_idx);
                if (a) {
                    item = _get_entry(a, struct bmp_idx_node, avl);
                    if (item->id <= node_id) {
                        avl_remove(&sb->bmp_idx, a);
                        free(item);
                        continue;
                    }
                    cur = item->id * 256;
                    break;
                }

                // no more reusable block
                cur = sb_bmp_size;
                break;
            } while (true);
        }
    }
    sb->num_free_blocks = 0;
    atomic_store_uint64_t(&sb->cur_alloc_bid, BLK_NOT_FOUND);

    // do the same work for the reserved blocks if exist
    rsv = sb->rsv_bmp;
    if (rsv &&
        atomic_cas_uint32_t(&rsv->status, SB_RSV_READY, SB_RSV_VOID)) {

        for (cur = rsv->cur_alloc_bid; cur < rsv->bmp_size; ++cur) {
            if (_is_bmp_set(rsv->bmp, cur)) {
                filemgr_add_stale_block(handle->file, cur, 1);
            }

            if ((cur % 256) == 0 && cur > 0) {
                // node ID changes
                // remove & free current bmp node
                node_id = cur / 256;
                query.id = node_id - 1;
                a = avl_search(&rsv->bmp_idx, &query.avl, _bmp_idx_cmp);
                if (a) {
                    item = _get_entry(a, struct bmp_idx_node, avl);
                    avl_remove(&rsv->bmp_idx, a);
                    free(item);
                }

                // move to next bmp node
                do {
                    a = avl_first(&rsv->bmp_idx);
                    if (a) {
                        item = _get_entry(a, struct bmp_idx_node, avl);
                        if (item->id <= node_id) {
                            avl_remove(&rsv->bmp_idx, a);
                            free(item);
                            continue;
                        }
                        cur = item->id * 256;
                        break;
                    }

                    // no more reusable block
                    cur = rsv->bmp_size;
                    break;
                } while (true);
            }
        }
        rsv->num_free_blocks = 0;
        rsv->cur_alloc_bid = BLK_NOT_FOUND;

        _free_bmp_idx(&rsv->bmp_idx);
        _rsv_free(rsv);
        free(rsv);
        sb->rsv_bmp = NULL;
    }

    // re-store into stale tree using next header's revnum
    filemgr_header_revnum_t revnum = handle->cur_header_revnum;
    fdb_gather_stale_blocks(handle, revnum+1, BLK_NOT_FOUND, BLK_NOT_FOUND, 0, NULL, false);
}